

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_SimpleArray<ON_Layer_*> *a)

{
  ON_Object *pOVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int count;
  ON_Layer *layer;
  int local_44;
  ON_Object *local_40;
  ON_Layer *local_38;
  
  if (a->m_a != (ON_Layer **)0x0) {
    memset(a->m_a,0,(long)a->m_capacity << 3);
  }
  a->m_count = 0;
  bVar2 = ReadInt32(this,1,&local_44);
  if (bVar2) {
    ON_SimpleArray<ON_Layer_*>::SetCapacity(a,(long)local_44);
    bVar2 = true;
    if (0 < local_44) {
      iVar4 = 0;
      do {
        local_38 = (ON_Layer *)0x0;
        local_40 = (ON_Object *)0x0;
        iVar3 = ReadObjectHelper(this,&local_40);
        pOVar1 = local_40;
        if (iVar3 != 1) {
LAB_003964e1:
          if (pOVar1 != (ON_Object *)0x0) {
            (*pOVar1->_vptr_ON_Object[4])(pOVar1);
          }
          goto LAB_003964f0;
        }
        local_38 = ON_Layer::Cast(local_40);
        if (local_38 == (ON_Layer *)0x0) goto LAB_003964e1;
        ON_SimpleArray<ON_Layer_*>::Append(a,&local_38);
        iVar4 = iVar4 + 1;
      } while (iVar4 < local_44);
      bVar2 = true;
    }
  }
  else {
LAB_003964f0:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ON_BinaryArchive::ReadArray( ON_SimpleArray<class ON_Layer*>& a)
{
  a.Empty();
  ON_Layer* layer;
  int i, count;
  bool rc = ReadInt( &count );
  if (rc)
  {
    a.SetCapacity(count);
    for  ( i = 0; i < count && rc; i++ )
    {
      layer = 0;
      ON_Object* p = 0;
      rc = (1==ReadObject(&p));
      if (rc)
      {
        layer = ON_Layer::Cast(p);
      }
      if (!rc || 0 == layer)
      {
        if ( p )
          delete p;
        rc = false;
        break;
      }
      a.Append(layer);
    }
  }
  return rc;
}